

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O3

void __thiscall
gepard::SegmentApproximator::arcToCurve
          (SegmentApproximator *this,FloatPoint *result,Float *startAngle,Float *endAngle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = sin(*startAngle);
  dVar2 = cos(*startAngle);
  dVar3 = sin(*endAngle);
  dVar4 = cos(*endAngle);
  dVar5 = tan((*endAngle - *startAngle) * 0.25);
  dVar5 = dVar5 * 1.3333333333333333;
  result->x = dVar1 * -dVar5 + dVar2;
  result->y = dVar2 * dVar5 + dVar1;
  result[1].x = dVar5 * dVar3 + dVar4;
  result[1].y = -dVar5 * dVar4 + dVar3;
  result[2].x = dVar4;
  result[2].y = dVar3;
  return;
}

Assistant:

void SegmentApproximator::arcToCurve(FloatPoint result[], const Float& startAngle, const Float& endAngle)
{
    const Float sinStartAngle = std::sin(startAngle);
    const Float cosStartAngle = std::cos(startAngle);
    const Float sinEndAngle = std::sin(endAngle);
    const Float cosEndAngle = std::cos(endAngle);

    const Float height = 4.0 / 3.0 * std::tan((endAngle - startAngle) / 4.0);

    result[0].x = cosStartAngle - height * sinStartAngle;
    result[0].y = sinStartAngle + height * cosStartAngle;
    result[1].x = cosEndAngle + height * sinEndAngle;
    result[1].y = sinEndAngle - height * cosEndAngle;
    result[2].x = cosEndAngle;
    result[2].y = sinEndAngle;
}